

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFuture.cpp
# Opt level: O2

void testFuture(void)

{
  code *pcVar1;
  int iVar2;
  undefined8 *puVar3;
  long *args;
  FutureTest t;
  char *local_168;
  usize local_160;
  usize local_150;
  FutureTest t_2;
  char *local_140;
  usize local_138;
  usize local_128;
  FutureTest t_3;
  char *local_118;
  usize local_110;
  usize local_100;
  Future<void> future;
  unsigned_long local_88;
  FutureTest t_4;
  char *local_78;
  usize local_70;
  usize local_60;
  FutureTest t_8;
  char *local_50;
  usize local_48;
  usize local_38;
  
  Future<void>::Future(&future);
  if (future._aborting == true) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x97,"!future.isAborting()");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  if (future._state == 2) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x98,"!future.isFinished()");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  if (future._state == 3) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x99,"!future.isAborted()");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<void>::start(&future,testFuture::FutureTest::staticVoidTest0);
  Future<void>::join(&future);
  if (future._aborting == true) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x9c,"!future.isAborting()");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  if (future._state != 2) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x9d,"future.isFinished()");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  if (future._state == 3) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x9e,"!future.isAborted()");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t._0_4_ = 0x20;
  Future<void>::start<int,int>(&future,testFuture::FutureTest::staticVoidTest1,(int *)&t);
  Future<void>::join(&future);
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t_2._0_4_ = 0x20;
  local_150 = 0;
  local_168 = "hallo1";
  local_160 = 6;
  t = (FutureTest)&local_168;
  Future<void>::start<int,String_const&,int,String>
            (&future,testFuture::FutureTest::staticVoidTest2,(int *)&t_2,(String *)&t);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t_3._0_4_ = 0x20;
  local_150 = 0;
  local_168 = "hallo1";
  local_160 = 6;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hallo2";
  local_138 = 6;
  t = (FutureTest)&local_168;
  Future<void>::start<int,String_const&,String_const&,int,String,String>
            (&future,testFuture::FutureTest::staticVoidTest3,(int *)&t_3,(String *)&t,(String *)&t_2
            );
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t_4._0_4_ = 0x20;
  local_150 = 0;
  local_168 = "hallo1";
  local_160 = 6;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hallo2";
  local_138 = 6;
  t_3 = (FutureTest)&local_118;
  local_100 = 0;
  local_118 = "hallo3";
  local_110 = 6;
  t = (FutureTest)&local_168;
  Future<void>::start<int,String_const&,String_const&,String_const&,int,String,String,String>
            (&future,testFuture::FutureTest::staticVoidTest4,(int *)&t_4,(String *)&t,(String *)&t_2
             ,(String *)&t_3);
  String::~String((String *)&t_3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t_8._0_4_ = 0x20;
  local_150 = 0;
  local_168 = "hallo1";
  local_160 = 6;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hallo2";
  local_138 = 6;
  t_3 = (FutureTest)&local_118;
  local_100 = 0;
  local_118 = "hallo3";
  local_110 = 6;
  t_4 = (FutureTest)&local_78;
  local_60 = 0;
  local_78 = "hallo4";
  local_70 = 6;
  t = (FutureTest)&local_168;
  Future<void>::
  start<int,String_const&,String_const&,String_const&,String_const&,int,String,String,String,String>
            (&future,testFuture::FutureTest::staticVoidTest5,(int *)&t_8,(String *)&t,(String *)&t_2
             ,(String *)&t_3,(String *)&t_4);
  String::~String((String *)&t_4);
  String::~String((String *)&t_3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t.check = 0x2a;
  puVar3 = (undefined8 *)operator_new(0x20);
  *puVar3 = (String *)&t;
  puVar3[1] = testFuture::FutureTest::memberVoidTest0;
  puVar3[2] = 0;
  puVar3[3] = &future;
  Future<void>::startProc
            (&future,Future<void>::proc<Call<void>::Member<testFuture()::FutureTest>::Args0>,puVar3)
  ;
  Future<void>::join(&future);
  if (t.called == false) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0xc4,"t.called");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t.check = 0x2a;
  puVar3 = (undefined8 *)operator_new(0x28);
  *puVar3 = (String *)&t;
  puVar3[1] = testFuture::FutureTest::memberVoidTest1;
  puVar3[2] = 0;
  *(undefined4 *)(puVar3 + 3) = 0x20;
  puVar3[4] = &future;
  Future<void>::startProc
            (&future,Future<void>::
                     proc<Call<void>::Member<testFuture()::FutureTest>::Args1<int,int>>,puVar3);
  Future<void>::join(&future);
  if (t.called == false) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0xcc,"t.called");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t_2.check = 0x2a;
  t = (FutureTest)&local_168;
  local_150 = 0;
  local_168 = "hallo1";
  local_160 = 6;
  puVar3 = (undefined8 *)operator_new(0x50);
  *puVar3 = (String *)&t_2;
  puVar3[1] = testFuture::FutureTest::memberVoidTest2;
  puVar3[2] = 0;
  *(undefined4 *)(puVar3 + 3) = 0x20;
  String::String((String *)(puVar3 + 4),(String *)&t);
  puVar3[9] = &future;
  Future<void>::startProc
            (&future,Future<void>::
                     proc<Call<void>::Member<testFuture()::FutureTest>::Args2<int,String_const&,int,String>>
             ,puVar3);
  String::~String((String *)&t);
  Future<void>::join(&future);
  if (t_2.called == false) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0xd4,"t.called");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t_3.check = 0x2a;
  local_150 = 0;
  local_168 = "hallo1";
  local_160 = 6;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hallo2";
  local_138 = 6;
  t = (FutureTest)&local_168;
  puVar3 = (undefined8 *)operator_new(0x78);
  *puVar3 = (String *)&t_3;
  puVar3[1] = testFuture::FutureTest::memberVoidTest3;
  puVar3[2] = 0;
  *(undefined4 *)(puVar3 + 3) = 0x20;
  String::String((String *)(puVar3 + 4),(String *)&t);
  String::String((String *)(puVar3 + 9),(String *)&t_2);
  puVar3[0xe] = &future;
  Future<void>::startProc
            (&future,Future<void>::
                     proc<Call<void>::Member<testFuture()::FutureTest>::Args3<int,String_const&,String_const&,int,String,String>>
             ,puVar3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  if (t_3.called == false) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0xdc,"t.called");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  t_4.check = 0x2a;
  t = (FutureTest)&local_168;
  local_150 = 0;
  local_168 = "hallo1";
  local_160 = 6;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hallo2";
  local_138 = 6;
  t_3 = (FutureTest)&local_118;
  local_100 = 0;
  local_118 = "hallo3";
  local_110 = 6;
  puVar3 = (undefined8 *)operator_new(0xa0);
  *puVar3 = (String *)&t_4;
  puVar3[1] = testFuture::FutureTest::memberVoidTest4;
  puVar3[2] = 0;
  *(undefined4 *)(puVar3 + 3) = 0x20;
  String::String((String *)(puVar3 + 4),(String *)&t);
  String::String((String *)(puVar3 + 9),(String *)&t_2);
  String::String((String *)(puVar3 + 0xe),(String *)&t_3);
  puVar3[0x13] = &future;
  Future<void>::startProc
            (&future,Future<void>::
                     proc<Call<void>::Member<testFuture()::FutureTest>::Args4<int,String_const&,String_const&,String_const&,int,String,String,String>>
             ,puVar3);
  String::~String((String *)&t_3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  if (t_4.called == false) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0xe4,"t.called");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<void>::~Future(&future);
  Future<void>::Future(&future);
  Future<unsigned_long>::start((Future<unsigned_long> *)&future,testFuture::FutureTest::staticTest0)
  ;
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 0x20) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0xeb,"future == 32");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  local_150 = 0;
  local_168 = "hello";
  local_160 = 5;
  t = (FutureTest)&local_168;
  Future<unsigned_long>::start<String_const&,String>
            ((Future<unsigned_long> *)&future,testFuture::FutureTest::staticTest1,(String *)&t);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 5) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0xf2,"future == 5");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  local_150 = 0;
  local_168 = "hello";
  local_160 = 5;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hello";
  local_138 = 5;
  t = (FutureTest)&local_168;
  Future<unsigned_long>::start<String_const&,String_const&,String,String>
            ((Future<unsigned_long> *)&future,testFuture::FutureTest::staticTest2,(String *)&t,
             (String *)&t_2);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 10) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0xf9,"future == 10");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  local_150 = 0;
  local_168 = "hello";
  local_160 = 5;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hello";
  local_138 = 5;
  t_3 = (FutureTest)&local_118;
  local_100 = 0;
  local_118 = "hello";
  local_110 = 5;
  t = (FutureTest)&local_168;
  Future<unsigned_long>::start<String_const&,String_const&,String_const&,String,String,String>
            ((Future<unsigned_long> *)&future,testFuture::FutureTest::staticTest3,(String *)&t,
             (String *)&t_2,(String *)&t_3);
  String::~String((String *)&t_3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 0xf) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x100,"future == 15");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  local_150 = 0;
  local_168 = "hello";
  local_160 = 5;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hello";
  local_138 = 5;
  t_3 = (FutureTest)&local_118;
  local_100 = 0;
  local_118 = "hello";
  local_110 = 5;
  t_4 = (FutureTest)&local_78;
  local_60 = 0;
  local_78 = "hello";
  local_70 = 5;
  t = (FutureTest)&local_168;
  Future<unsigned_long>::
  start<String_const&,String_const&,String_const&,String_const&,String,String,String,String>
            ((Future<unsigned_long> *)&future,testFuture::FutureTest::staticTest4,(String *)&t,
             (String *)&t_2,(String *)&t_3,(String *)&t_4);
  String::~String((String *)&t_4);
  String::~String((String *)&t_3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 0x14) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x107,"future == 20");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  local_150 = 0;
  local_168 = "hello";
  local_160 = 5;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hello";
  local_138 = 5;
  t_3 = (FutureTest)&local_118;
  local_100 = 0;
  local_118 = "hello";
  local_110 = 5;
  t_4 = (FutureTest)&local_78;
  local_60 = 0;
  local_78 = "hello";
  local_70 = 5;
  t_8 = (FutureTest)&local_50;
  local_38 = 0;
  local_50 = "hello";
  local_48 = 5;
  t = (FutureTest)&local_168;
  Future<unsigned_long>::
  start<String_const&,String_const&,String_const&,String_const&,String_const&,String,String,String,String,String>
            ((Future<unsigned_long> *)&future,testFuture::FutureTest::staticTest5,(String *)&t,
             (String *)&t_2,(String *)&t_3,(String *)&t_4,(String *)&t_8);
  String::~String((String *)&t_8);
  String::~String((String *)&t_4);
  String::~String((String *)&t_3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 0x19) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x10e,"future == 25");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  t_2.check = 0x2a;
  t = (FutureTest)&local_168;
  local_150 = 0;
  local_168 = "hello";
  local_160 = 5;
  puVar3 = (undefined8 *)operator_new(0x48);
  *puVar3 = (String *)&t_2;
  puVar3[1] = testFuture::FutureTest::memberTest1;
  puVar3[2] = 0;
  String::String((String *)(puVar3 + 3),(String *)&t);
  puVar3[8] = &future;
  Future<void>::startProc
            (&future,Future<unsigned_long>::
                     proc<Call<unsigned_long>::Member<testFuture()::FutureTest>::Args1<String_const&,String>>
             ,puVar3);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 0x2f) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x116,"future == 42 + 5");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  t_3.check = 0x2a;
  t = (FutureTest)&local_168;
  local_150 = 0;
  local_168 = "hello1";
  local_160 = 6;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hello2";
  local_138 = 6;
  puVar3 = (undefined8 *)operator_new(0x70);
  *puVar3 = (String *)&t_3;
  puVar3[1] = testFuture::FutureTest::memberTest2;
  puVar3[2] = 0;
  String::String((String *)(puVar3 + 3),(String *)&t);
  String::String((String *)(puVar3 + 8),(String *)&t_2);
  puVar3[0xd] = &future;
  Future<void>::startProc
            (&future,Future<unsigned_long>::
                     proc<Call<unsigned_long>::Member<testFuture()::FutureTest>::Args2<String_const&,String_const&,String,String>>
             ,puVar3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 0x36) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x11e,"future == 42 + 6 * 2");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  t_4.check = 0x2a;
  t = (FutureTest)&local_168;
  local_150 = 0;
  local_168 = "hello1";
  local_160 = 6;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hello2";
  local_138 = 6;
  t_3 = (FutureTest)&local_118;
  local_100 = 0;
  local_118 = "hello3";
  local_110 = 6;
  puVar3 = (undefined8 *)operator_new(0x98);
  *puVar3 = (String *)&t_4;
  puVar3[1] = testFuture::FutureTest::memberTest3;
  puVar3[2] = 0;
  String::String((String *)(puVar3 + 3),(String *)&t);
  String::String((String *)(puVar3 + 8),(String *)&t_2);
  String::String((String *)(puVar3 + 0xd),(String *)&t_3);
  puVar3[0x12] = &future;
  Future<void>::startProc
            (&future,Future<unsigned_long>::
                     proc<Call<unsigned_long>::Member<testFuture()::FutureTest>::Args3<String_const&,String_const&,String_const&,String,String,String>>
             ,puVar3);
  String::~String((String *)&t_3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 0x3c) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x126,"future == 42 + 6 * 3");
    if (iVar2 != 0) goto LAB_00103a2f;
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  Future<void>::Future(&future);
  t_8.check = 0x2a;
  local_150 = 0;
  local_168 = "hello1";
  local_160 = 6;
  t_2 = (FutureTest)&local_140;
  local_128 = 0;
  local_140 = "hello2";
  local_138 = 6;
  t_3 = (FutureTest)&local_118;
  local_100 = 0;
  local_118 = "hello3";
  local_110 = 6;
  t_4 = (FutureTest)&local_78;
  local_60 = 0;
  local_78 = "hello4";
  local_70 = 6;
  t = (FutureTest)&local_168;
  args = (long *)operator_new(0xc0);
  *args = (long)&t_8;
  args[1] = (long)testFuture::FutureTest::memberTest4;
  args[2] = 0;
  String::String((String *)(args + 3),(String *)&t);
  String::String((String *)(args + 8),(String *)&t_2);
  String::String((String *)(args + 0xd),(String *)&t_3);
  String::String((String *)(args + 0x12),(String *)&t_4);
  args[0x17] = (long)&future;
  Future<void>::startProc
            (&future,Future<unsigned_long>::
                     proc<Call<unsigned_long>::Member<testFuture()::FutureTest>::Args4<String_const&,String_const&,String_const&,String_const&,String,String,String,String>>
             ,args);
  String::~String((String *)&t_4);
  String::~String((String *)&t_3);
  String::~String((String *)&t_2);
  String::~String((String *)&t);
  Future<void>::join(&future);
  Future<void>::join(&future);
  if (local_88 != 0x42) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestFuture.cpp"
                          ,0x12e,"future == 42 + 6 * 4");
    if (iVar2 != 0) {
LAB_00103a2f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  Future<unsigned_long>::~Future((Future<unsigned_long> *)&future);
  return;
}

Assistant:

void testFuture()
{
  class FutureTest
  {
  public:
    bool called;

  public:
    FutureTest() : check(42) {}

    static void staticVoidTest0()
    {
    }

    static void staticVoidTest1(int check)
    {
      ASSERT(check == 32);
    }

    static void staticVoidTest2(int check, const String& str1)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
    }

    static void staticVoidTest3(int check, const String& str1, const String& str2)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
    }

    static void staticVoidTest4(int check, const String& str1, const String& str2, const String& str3)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
    }

    static void staticVoidTest5(int check, const String& str1, const String& str2, const String& str3, const String& str4)
    {
      ASSERT(check == 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
      ASSERT(str4 == "hallo4");
    }

    void memberVoidTest0()
    {
      called = true;
    }

    void memberVoidTest1(int check)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
    }

    void memberVoidTest2(int check, const String& str1)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
    }

    void memberVoidTest3(int check, const String& str1, const String& str2)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
    }

    void memberVoidTest4(int check, const String& str1, const String& str2, const String& str3)
    {
      called = true;
      ASSERT(this->check + check == 42 + 32);
      ASSERT(str1 == "hallo1");
      ASSERT(str2 == "hallo2");
      ASSERT(str3 == "hallo3");
    }

    static usize staticTest0()
    {
      return 32;
    }

    static usize staticTest1(const String& str)
    {
      return str.length();
    }

    static usize staticTest2(const String& str1, const String& str2)
    {
      return str1.length() + str2.length();
    }

    static usize staticTest3(const String& str1, const String& str2, const String& str3)
    {
      return str1.length() + str2.length() + str3.length();
    }

    static usize staticTest4(const String& str1, const String& str2, const String& str3, const String& str4)
    {
      return str1.length() + str2.length() + str3.length() + str4.length();
    }

    static usize staticTest5(const String& str1, const String& str2, const String& str3, const String& str4, const String& str5)
    {
      return str1.length() + str2.length() + str3.length() + str4.length() + str5.length();
    }

    usize memberTest0()
    {
      return check;
    }

    usize memberTest1(const String& str)
    {
      return check + str.length();
    }

    usize memberTest2(const String& str1, const String& str2)
    {
      return check + str1.length() + str2.length();
    }

    usize memberTest3(const String& str1, const String& str2, const String& str3)
    {
      return check + str1.length() + str2.length() + str3.length();
    }

    usize memberTest4(const String& str1, const String& str2, const String& str3, const String& str4)
    {
      return check + str1.length() + str2.length() + str3.length() + str4.length();
    }

  private:
    int check;
  };

  {
    Future<void> future;
    ASSERT(!future.isAborting());
    ASSERT(!future.isFinished());
    ASSERT(!future.isAborted());
    future.start(&FutureTest::staticVoidTest0);
    future.join();
    ASSERT(!future.isAborting());
    ASSERT(future.isFinished());
    ASSERT(!future.isAborted());
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest1, 32);
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest2, 32, String("hallo1"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest3, 32, String("hallo1"), String("hallo2"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest4, 32, String("hallo1"), String("hallo2"), String("hallo3"));
    future.join();
  }

  {
    Future<void> future;
    future.start(&FutureTest::staticVoidTest5, 32, String("hallo1"), String("hallo2"), String("hallo3"), String("hallo4"));
    future.join();
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest0);
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest1, 32);
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest2, 32, String("hallo1"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest3, 32, String("hallo1"), String("hallo2"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<void> future;
    FutureTest t;
    future.start(t, &FutureTest::memberVoidTest4, 32, String("hallo1"), String("hallo2"), String("hallo3"));
    future.join();
    ASSERT(t.called);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest0);
    future.join();
    ASSERT(future == 32);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest1, String("hello"));
    future.join();
    ASSERT(future == 5);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest2, String("hello"), String("hello"));
    future.join();
    ASSERT(future == 10);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest3, String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 15);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest4, String("hello"), String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 20);
  }

  {
    Future<usize> future;
    future.start(&FutureTest::staticTest5, String("hello"), String("hello"), String("hello"), String("hello"), String("hello"));
    future.join();
    ASSERT(future == 25);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest1, String("hello"));
    future.join();
    ASSERT(future == 42 + 5);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest2, String("hello1"), String("hello2"));
    future.join();
    ASSERT(future == 42 + 6 * 2);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest3, String("hello1"), String("hello2"), String("hello3"));
    future.join();
    ASSERT(future == 42 + 6 * 3);
  }

  {
    Future<usize> future;
    FutureTest t;
    future.start(t, &FutureTest::memberTest4, String("hello1"), String("hello2"), String("hello3"), String("hello4"));
    future.join();
    ASSERT(future == 42 + 6 * 4);
  }
}